

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGeneratorFactory.h
# Opt level: O1

cmGlobalGenerator * __thiscall
cmGlobalGeneratorSimpleFactory<cmGlobalNinjaGenerator>::CreateGlobalGenerator
          (cmGlobalGeneratorSimpleFactory<cmGlobalNinjaGenerator> *this,string *name,cmake *cm)

{
  int iVar1;
  cmGlobalNinjaGenerator *this_00;
  undefined4 local_20;
  undefined2 local_1c;
  
  local_20 = 0x6a6e694e;
  local_1c = 0x61;
  if ((name->_M_string_length == 5) &&
     (iVar1 = bcmp((name->_M_dataplus)._M_p,&local_20,5), iVar1 == 0)) {
    this_00 = (cmGlobalNinjaGenerator *)operator_new(0x788);
    cmGlobalNinjaGenerator::cmGlobalNinjaGenerator(this_00,cm);
    return &this_00->super_cmGlobalGenerator;
  }
  return (cmGlobalGenerator *)0x0;
}

Assistant:

virtual cmGlobalGenerator*
  CreateGlobalGenerator(const std::string& name, cmake* cm) const {
    if (name != T::GetActualName()) return 0;
    return new T(cm); }